

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O2

void __thiscall BigInt::BigInt(BigInt *this,string *value_and_sign)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  string asStack_68 [32];
  string local_48;
  
  (this->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cVar1 = *(value_and_sign->_M_dataplus)._M_p;
  if (cVar1 == '-') {
    std::__cxx11::string::substr((ulong)asStack_68,(ulong)value_and_sign);
  }
  else {
    if (cVar1 != '+') goto LAB_00103d67;
    std::__cxx11::string::substr((ulong)asStack_68,(ulong)value_and_sign);
  }
  std::__cxx11::string::operator=((string *)value_and_sign,asStack_68);
  std::__cxx11::string::~string(asStack_68);
LAB_00103d67:
  lVar4 = -1;
  do {
    if ((1 - value_and_sign->_M_string_length) + lVar4 == -1) break;
    lVar2 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while ((value_and_sign->_M_dataplus)._M_p[lVar2] == '0');
  std::__cxx11::string::substr((ulong)asStack_68,(ulong)value_and_sign);
  std::__cxx11::string::operator=((string *)value_and_sign,asStack_68);
  std::__cxx11::string::~string(asStack_68);
  bVar3 = std::operator==(value_and_sign,"0");
  std::__cxx11::string::string((string *)&local_48,(string *)value_and_sign);
  set_number(this,&local_48,cVar1 != '-' || bVar3);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

BigInt::BigInt(string value_and_sign) {
    bool positive;
    if (value_and_sign[0] == '-') {
        positive = false;
        value_and_sign = value_and_sign.substr(1);
    } else if (value_and_sign[0] == '+') {
        positive = true;
        value_and_sign = value_and_sign.substr(1);
    } else {
        positive = true;
    }
    int i = 0;
    while (i < value_and_sign.size() - 1) {
        if (value_and_sign[i] != '0') {
            break;
        }
        ++i;
    }
    value_and_sign = value_and_sign.substr(i);
    if (value_and_sign == "0") {
        positive = true;
    }
    //    printf("structor %s \n", value_and_sign.c_str());
    this->set_number(value_and_sign, positive);
}